

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::SetupProperties(LWOImporter *this,Importer *pImp)

{
  Importer *this_00;
  int iVar1;
  uint uVar2;
  allocator local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  LWOImporter *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  iVar1 = Importer::GetPropertyInteger(pImp,"FAVOUR_SPEED",0);
  this->configSpeedFlag = iVar1 != 0;
  uVar2 = Importer::GetPropertyInteger(local_18,"IMPORT_LWO_ONE_LAYER_ONLY",-1);
  this_00 = local_18;
  this->configLayerIndex = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  Importer::GetPropertyString(&local_38,this_00,"IMPORT_LWO_ONE_LAYER_ONLY",&local_58);
  std::__cxx11::string::operator=((string *)&this->configLayerName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void LWOImporter::SetupProperties(const Importer* pImp)
{
    configSpeedFlag  = ( 0 != pImp->GetPropertyInteger(AI_CONFIG_FAVOUR_SPEED,0) ? true : false);
    configLayerIndex = pImp->GetPropertyInteger (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,UINT_MAX);
    configLayerName  = pImp->GetPropertyString  (AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,"");
}